

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern-computer.cpp
# Opt level: O0

void __thiscall mahjong::PatternComputer::special(PatternComputer *this,PlayerHand *hand)

{
  initializer_list<mahjong::Tile> __l;
  initializer_list<mahjong::Pattern> __l_00;
  bool bVar1;
  reference pTVar2;
  mapped_type *pmVar3;
  size_type sVar4;
  reference ppVar5;
  allocator<mahjong::Tile> local_161;
  Tile local_160;
  Tile local_15c;
  iterator local_158;
  size_type local_150;
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> local_148;
  undefined1 local_130 [8];
  Pair p;
  pair<const_mahjong::Tile,_int> it_1;
  iterator __end2;
  iterator __begin2;
  map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
  *__range2;
  WiningHand wining_hand;
  IsSimple local_8d;
  Tile local_8c;
  iterator iStack_88;
  Tile it;
  iterator __end1;
  iterator __begin1;
  FreeTiles local_68;
  vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> *local_50;
  FreeTiles *__range1;
  map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
  unique_tiles;
  PlayerHand *hand_local;
  PatternComputer *this_local;
  
  unique_tiles._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)hand;
  std::
  map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
  ::map((map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
         *)&__range1);
  PlayerHand::makeFreeTiles
            (&local_68,(PlayerHand *)unique_tiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
  local_50 = &local_68;
  __end1 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::begin(local_50);
  iStack_88 = std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::end(local_50);
  while (bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff78), bVar1) {
    pTVar2 = __gnu_cxx::
             __normal_iterator<mahjong::Tile_*,_std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>_>
             ::operator*(&__end1);
    local_8c = *pTVar2;
    bVar1 = IsSimple::operator()(&local_8d,&local_8c);
    if (!bVar1) {
      pmVar3 = std::
               map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
               ::operator[]((map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
                             *)&__range1,&local_8c);
      *pmVar3 = *pmVar3 + 1;
    }
    __gnu_cxx::
    __normal_iterator<mahjong::Tile_*,_std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>_>
    ::operator++(&__end1);
  }
  std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::~vector(&local_68);
  sVar4 = std::
          map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
          ::size((map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
                  *)&__range1);
  if (sVar4 == 0xd) {
    wining_hand._76_4_ = 0x28;
    __l_00._M_len = 1;
    __l_00._M_array = (iterator)&wining_hand.field_0x4c;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    operator=(&this->highest_patterns,__l_00);
    WiningHand::WiningHand((WiningHand *)&__range2);
    wining_hand.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ =
         PlayerHand::lastTile
                   ((PlayerHand *)unique_tiles._M_t._M_impl.super__Rb_tree_header._M_node_count);
    __end2 = std::
             map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
             ::begin((map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
                      *)&__range1);
    it_1 = (pair<const_mahjong::Tile,_int>)
           std::
           map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
           ::end((map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
                  *)&__range1);
    while (bVar1 = std::operator!=(&__end2,(_Self *)&it_1), bVar1) {
      ppVar5 = std::_Rb_tree_iterator<std::pair<const_mahjong::Tile,_int>_>::operator*(&__end2);
      p.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = *(pointer *)ppVar5;
      if (p.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ == 2) {
        local_160 = (Tile)p.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_15c = (Tile)p.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage;
        local_158 = &local_160;
        local_150 = 2;
        std::allocator<mahjong::Tile>::allocator(&local_161);
        __l._M_len = local_150;
        __l._M_array = local_158;
        std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::vector
                  (&local_148,__l,&local_161);
        Pair::Pair((Pair *)local_130,&local_148);
        std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::~vector(&local_148);
        std::allocator<mahjong::Tile>::~allocator(&local_161);
        std::vector<mahjong::Pair,_std::allocator<mahjong::Pair>_>::push_back
                  ((vector<mahjong::Pair,_std::allocator<mahjong::Pair>_> *)&__range2,
                   (value_type *)local_130);
        Pair::~Pair((Pair *)local_130);
      }
      else {
        std::vector<mahjong::Tile,_std::allocator<mahjong::Tile>_>::push_back
                  ((vector<mahjong::Tile,_std::allocator<mahjong::Tile>_> *)
                   &wining_hand.melds.
                    super__Vector_base<mahjong::Meld,_std::allocator<mahjong::Meld>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,
                   (value_type *)
                   &p.tiles.super__Vector_base<mahjong::Tile,_std::allocator<mahjong::Tile>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::_Rb_tree_iterator<std::pair<const_mahjong::Tile,_int>_>::operator++(&__end2);
    }
    WiningHand::operator=(&this->highest_wining_hand,(WiningHand *)&__range2);
    WiningHand::~WiningHand((WiningHand *)&__range2);
  }
  std::
  map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
  ::~map((map<mahjong::Tile,_int,_std::less<mahjong::Tile>,_std::allocator<std::pair<const_mahjong::Tile,_int>_>_>
          *)&__range1);
  return;
}

Assistant:

void PatternComputer::special(const PlayerHand& hand)
{
	map<Tile, int> unique_tiles;
	for (auto it : hand.makeFreeTiles())
	{
		if (IsSimple()(it)) continue;
		unique_tiles[it]++;
	}

	if (13 == unique_tiles.size())
	{
		highest_patterns = { Pattern::ThirteenOrphans };

		WiningHand wining_hand;
		wining_hand.last_tile = hand.lastTile();
		for (auto it : unique_tiles)
		{
			if (2 == it.second)
			{
				auto p = Pair({ it.first, it.first });
				wining_hand.pairs.push_back(p);
			}
			else
			{
				wining_hand.tiles.push_back(it.first);
			}
		}
		highest_wining_hand = wining_hand;
	}
}